

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprListSetName(Parse *pParse,ExprList *pList,Token *pName,int dequote)

{
  char *pcVar1;
  int in_ECX;
  long lVar2;
  char *in_RDX;
  sqlite3 *in_RSI;
  long in_RDI;
  ExprList_item *pItem;
  undefined4 in_stack_ffffffffffffffe0;
  sqlite3 *pParse_00;
  
  if (in_RSI != (sqlite3 *)0x0) {
    lVar2 = (long)(*(int *)&in_RSI->pVfs + -1);
    pParse_00 = in_RSI;
    pcVar1 = sqlite3DbStrNDup(in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
    *(char **)(in_RSI->aLimit + lVar2 * 6 + -0x1e) = pcVar1;
    if ((in_ECX != 0) &&
       (sqlite3Dequote(*(char **)(in_RSI->aLimit + lVar2 * 6 + -0x1e)),
       1 < *(byte *)(in_RDI + 0x134))) {
      sqlite3RenameTokenMap
                ((Parse *)pParse_00,in_RDX,(Token *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetName(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to add the span. */
  const Token *pName,     /* Name to be added */
  int dequote             /* True to cause the name to be dequoted */
){
  assert( pList!=0 || pParse->db->mallocFailed!=0 );
  assert( pParse->eParseMode!=PARSE_MODE_UNMAP || dequote==0 );
  if( pList ){
    struct ExprList_item *pItem;
    assert( pList->nExpr>0 );
    pItem = &pList->a[pList->nExpr-1];
    assert( pItem->zEName==0 );
    assert( pItem->fg.eEName==ENAME_NAME );
    pItem->zEName = sqlite3DbStrNDup(pParse->db, pName->z, pName->n);
    if( dequote ){
      /* If dequote==0, then pName->z does not point to part of a DDL
      ** statement handled by the parser. And so no token need be added
      ** to the token-map.  */
      sqlite3Dequote(pItem->zEName);
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenMap(pParse, (const void*)pItem->zEName, pName);
      }
    }
  }
}